

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O1

void skynet_mq_mark_release(message_queue *q)

{
  int iVar1;
  
  do {
    LOCK();
    iVar1 = (q->lock).lock;
    (q->lock).lock = 1;
    UNLOCK();
  } while (iVar1 != 0);
  if (q->release == 0) {
    q->release = 1;
    if (q->in_global != 1) {
      skynet_globalmq_push(q);
    }
    (q->lock).lock = 0;
    return;
  }
  __assert_fail("q->release == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_mq.c"
                ,0xde,"void skynet_mq_mark_release(struct message_queue *)");
}

Assistant:

void 
skynet_mq_mark_release(struct message_queue *q) {
	SPIN_LOCK(q)
	assert(q->release == 0);
	q->release = 1;
	if (q->in_global != MQ_IN_GLOBAL) {
		skynet_globalmq_push(q);
	}
	SPIN_UNLOCK(q)
}